

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

void __thiscall Lui::Lui(Lui *this,uchar *data)

{
  order::order(&this->super_order,data);
  (this->super_order)._vptr_order = (_func_int **)&PTR_ID_exe_00106b28;
  *(undefined8 *)&(this->super_order).op = 0;
  this->rd_id = 0;
  (this->super_order).EX_need = true;
  (this->super_order).MEM_need = false;
  (this->super_order).WB_need = true;
  return;
}

Assistant:

Lui::Lui(unsigned char *data) : order(data) {
    op=lui;
    imm=0;
    rd_id=0;
    EX_need=true;
    MEM_need=false;
    WB_need=true;
}